

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.c
# Opt level: O1

conv_object conv_init(int N,int L)

{
  int iVar1;
  conv_object pcVar2;
  fft_real_object pfVar3;
  uint M;
  
  pcVar2 = (conv_object)malloc(0x20);
  M = (L + N) - 2;
  do {
    M = M + 1;
    iVar1 = factorf(M);
  } while ((M & 1) != 0 || iVar1 != 1);
  pcVar2->clen = M;
  pcVar2->ilen1 = N;
  pcVar2->ilen2 = L;
  pfVar3 = fft_real_init(M,1);
  pcVar2->fobj = pfVar3;
  pfVar3 = fft_real_init(M,-1);
  pcVar2->iobj = pfVar3;
  return pcVar2;
}

Assistant:

conv_object conv_init(int N, int L) {
	
	conv_object obj = NULL;
	int conv_len;
	conv_len = N + L - 1;
		
	obj = (conv_object) malloc (sizeof(struct conv_set));
	 
	//obj->clen = npow2(conv_len);
	//obj->clen = conv_len;
	obj->clen = findnexte(conv_len);
	obj->ilen1 = N;
	obj->ilen2 = L;
	
	obj->fobj = fft_real_init(obj->clen,1);
	obj->iobj = fft_real_init(obj->clen,-1);
	
	return obj;
	
}